

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_front_back_Test::IntrusiveListTest_front_back_Test
          (IntrusiveListTest_front_back_Test *this)

{
  IntrusiveListTest_front_back_Test *this_local;
  
  anon_unknown.dwarf_4eaaf::IntrusiveListTest::IntrusiveListTest(&this->super_IntrusiveListTest);
  (this->super_IntrusiveListTest).super_Test._vptr_Test =
       (_func_int **)&PTR__IntrusiveListTest_front_back_Test_005aeaf0;
  return;
}

Assistant:

TEST_F(IntrusiveListTest, front_back) {
  TestObjectList list;

  list.emplace_back(1);
  ASSERT_EQ(1, list.front().data);
  ASSERT_EQ(1, list.back().data);

  list.emplace_back(2);
  ASSERT_EQ(1, list.front().data);
  ASSERT_EQ(2, list.back().data);

  const TestObjectList& clist = list;
  ASSERT_EQ(1, clist.front().data);
  ASSERT_EQ(2, clist.back().data);
}